

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_audio_buffer_ref_get_length_in_pcm_frames
                    (ma_audio_buffer_ref *pAudioBufferRef,ma_uint64 *pLength)

{
  ma_result mVar1;
  
  mVar1 = MA_INVALID_ARGS;
  if ((pLength != (ma_uint64 *)0x0) && (*pLength = 0, pAudioBufferRef != (ma_audio_buffer_ref *)0x0)
     ) {
    *pLength = pAudioBufferRef->sizeInFrames;
    mVar1 = MA_SUCCESS;
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_audio_buffer_ref_get_length_in_pcm_frames(const ma_audio_buffer_ref* pAudioBufferRef, ma_uint64* pLength)
{
    if (pLength == NULL) {
        return MA_INVALID_ARGS;
    }

    *pLength = 0;

    if (pAudioBufferRef == NULL) {
        return MA_INVALID_ARGS;
    }

    *pLength = pAudioBufferRef->sizeInFrames;

    return MA_SUCCESS;
}